

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_BufCollectTfoCone_rec(Abc_Obj_t *pNode,Vec_Int_t *vNodes)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
    if (uVar2 - 5 < 0xfffffffe) {
      if ((7 < uVar2) || ((0xa4U >> uVar2 & 1) == 0)) {
        __assert_fail("Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                      ,0x24d,"void Abc_BufCollectTfoCone_rec(Abc_Obj_t *, Vec_Int_t *)");
      }
      for (lVar3 = 0; lVar3 < (pNode->vFanouts).nSize; lVar3 = lVar3 + 1) {
        Abc_BufCollectTfoCone_rec
                  ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar3]],vNodes);
      }
      if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
        Vec_IntPush(vNodes,pNode->Id);
        return;
      }
    }
  }
  return;
}

Assistant:

void Abc_BufCollectTfoCone_rec( Abc_Obj_t * pNode, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pNext;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode) );
    Abc_ObjForEachFanout( pNode, pNext, i )
        Abc_BufCollectTfoCone_rec( pNext, vNodes );
    if ( Abc_ObjIsNode(pNode) )
        Vec_IntPush( vNodes, Abc_ObjId(pNode) );
}